

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::PollStream::PollStream(PollStream *this,string *targetName)

{
  _func_int *p_Var1;
  int iVar2;
  char *line;
  bool local_41;
  string *targetName_local;
  PollStream *this_local;
  
  Stream::Stream((Stream *)&(this->super_SelectableStream).field_0x18,targetName);
  SelectableStream::SelectableStream
            (&this->super_SelectableStream,&PTR_construction_vtable_24__00152688,targetName);
  (this->super_SelectableStream)._vptr_SelectableStream = (_func_int **)&PTR__PollStream_001525f0;
  *(undefined ***)&(this->super_SelectableStream).field_0x18 = &PTR__PollStream_00152658;
  ParameterSet::add((ParameterSet *)
                    (&(this->super_SelectableStream).field_0x30 +
                    (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),
                    "tcppoll:host;port;connectionPort=-1;sock=-1");
  p_Var1 = (this->super_SelectableStream)._vptr_SelectableStream[-3];
  line = (char *)std::__cxx11::string::c_str();
  ParameterSet::add((ParameterSet *)(&(this->super_SelectableStream).field_0x30 + (long)p_Var1),line
                   );
  iVar2 = getOrCreateSocket((ParameterSet *)
                            (&(this->super_SelectableStream).field_0x30 +
                            (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]));
  (this->super_SelectableStream).fd = iVar2;
  iVar2 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_SelectableStream).field_0x30 +
                     (long)(this->super_SelectableStream)._vptr_SelectableStream[-3]),"sock");
  local_41 = false;
  if (iVar2 < 0) {
    local_41 = -1 < (this->super_SelectableStream).fd;
  }
  (this->super_SelectableStream).field_0x11 = local_41;
  return;
}

Assistant:

explicit PollStream(const std::string& targetName) :
			Stream(targetName),
			SelectableStream(targetName)
		{
			target.add("tcppoll:host;port;connectionPort=-1;sock=-1");
			target.add(targetName.c_str());
			fd = getOrCreateSocket(target);
			dtorCloseSocket = target.get<int>("sock") < 0 && fd >= 0; // if getOrCreateSocket created the socket we will have to close it
		}